

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildCommand.cxx
# Opt level: O2

bool cmBuildCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  pointer pbVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  cmValue cVar6;
  cmGlobalGenerator *pcVar7;
  string *psVar8;
  ulong uVar9;
  ulong uVar10;
  string *psVar11;
  string *psVar12;
  int iVar13;
  string_view value;
  allocator<char> local_141;
  string configType;
  string configuration;
  string target;
  string project_name;
  string makecommand;
  string local_70;
  string parallel;
  
  psVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((long)psVar8 - (long)psVar12 == 0x40) {
    pcVar1 = status->Makefile;
    cVar6 = cmMakefile::GetDefinition(pcVar1,psVar12);
    configType._M_dataplus._M_p = (pointer)&configType.field_2;
    configType._M_string_length = 0;
    configType.field_2._M_local_buf[0] = '\0';
    bVar4 = cmsys::SystemTools::GetEnv("CMAKE_CONFIG_TYPE",&configType);
    if (!bVar4 || configType._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&configType);
    }
    pcVar7 = cmMakefile::GetGlobalGenerator(pcVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configuration,"",(allocator<char> *)&parallel);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&project_name,"",(allocator<char> *)&local_70);
    std::__cxx11::string::string<std::allocator<char>>((string *)&target,"",&local_141);
    bVar4 = cmMakefile::IgnoreErrorsCMP0061(pcVar1);
    cmGlobalGenerator::GenerateCMakeBuildCommand
              (&makecommand,pcVar7,&configuration,&configType,&project_name,&target,bVar4);
    std::__cxx11::string::~string((string *)&target);
    std::__cxx11::string::~string((string *)&project_name);
    std::__cxx11::string::~string((string *)&configuration);
    if (cVar6.Value == (string *)0x0) {
      cmMakefile::AddCacheDefinition
                (pcVar1,psVar12,makecommand._M_dataplus._M_p,
                 "Command used to build entire project from the command line.",STRING,false);
    }
    std::__cxx11::string::~string((string *)&makecommand);
    std::__cxx11::string::~string((string *)&configType);
    bVar4 = true;
  }
  else if (psVar12 == psVar8) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configType,"requires at least one argument naming a CMake variable",
               (allocator<char> *)&makecommand);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&configType);
    bVar4 = false;
  }
  else {
    configuration._M_dataplus._M_p = (pointer)&configuration.field_2;
    configuration._M_string_length = 0;
    iVar13 = 0;
    project_name._M_dataplus._M_p = (pointer)&project_name.field_2;
    project_name._M_string_length = 0;
    target._M_dataplus._M_p = (pointer)&target.field_2;
    target._M_string_length = 0;
    configuration.field_2._M_local_buf[0] = '\0';
    project_name.field_2._M_local_buf[0] = '\0';
    target.field_2._M_local_buf[0] = '\0';
    parallel._M_dataplus._M_p = (pointer)&parallel.field_2;
    parallel._M_string_length = 0;
    parallel.field_2._M_local_buf[0] = '\0';
    psVar11 = psVar12;
    for (uVar10 = 1; uVar9 = (long)psVar8 - (long)psVar11 >> 5, bVar4 = uVar9 <= uVar10,
        uVar10 < uVar9; uVar10 = (ulong)((int)uVar10 + 1)) {
      bVar5 = std::operator==(psVar11 + uVar10,"CONFIGURATION");
      iVar3 = 1;
      if (!bVar5) {
        bVar5 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar10,"PROJECT_NAME");
        iVar3 = 2;
        if (!bVar5) {
          bVar5 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar10,"TARGET");
          iVar3 = 3;
          if (!bVar5) {
            bVar5 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar10,
                                    "PARALLEL_LEVEL");
            iVar3 = 4;
            if (!bVar5) {
              if (3 < iVar13 - 1U) {
                configType._M_dataplus._M_p = (pointer)0x12;
                configType._M_string_length = (long)"called with unknown argument \"" + 0xc;
                pbVar2 = (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                makecommand._M_string_length = (size_type)pbVar2[uVar10]._M_dataplus._M_p;
                makecommand._M_dataplus._M_p = (pointer)pbVar2[uVar10]._M_string_length;
                cmStrCat<char[2]>(&local_70,(cmAlphaNum *)&configType,(cmAlphaNum *)&makecommand,
                                  (char (*) [2])0x5eaac5);
                std::__cxx11::string::_M_assign((string *)&status->Error);
                psVar12 = &local_70;
                goto LAB_0025fd61;
              }
              psVar8 = &configuration;
              switch(iVar13) {
              case 2:
                psVar8 = &project_name;
                break;
              case 3:
                psVar8 = &target;
                break;
              case 4:
                psVar8 = &parallel;
              }
              std::__cxx11::string::_M_assign((string *)psVar8);
              iVar3 = 0;
            }
          }
        }
      }
      iVar13 = iVar3;
      psVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      psVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    if (configuration._M_string_length == 0) {
      cmsys::SystemTools::GetEnv("CMAKE_CONFIG_TYPE",&configuration);
      if (configuration._M_string_length == 0) {
        std::__cxx11::string::assign((char *)&configuration);
      }
    }
    pcVar1 = status->Makefile;
    if (project_name._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&configType,"Ignoring PROJECT_NAME option because it has no effect.",
                 (allocator<char> *)&makecommand);
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&configType);
      std::__cxx11::string::~string((string *)&configType);
    }
    pcVar7 = cmMakefile::GetGlobalGenerator(pcVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&makecommand,"",(allocator<char> *)&local_70);
    bVar5 = cmMakefile::IgnoreErrorsCMP0061(pcVar1);
    cmGlobalGenerator::GenerateCMakeBuildCommand
              (&configType,pcVar7,&target,&configuration,&parallel,&makecommand,bVar5);
    std::__cxx11::string::~string((string *)&makecommand);
    value._M_str = configType._M_dataplus._M_p;
    value._M_len = configType._M_string_length;
    cmMakefile::AddDefinition(pcVar1,psVar12,value);
    psVar12 = &configType;
LAB_0025fd61:
    std::__cxx11::string::~string((string *)psVar12);
    std::__cxx11::string::~string((string *)&parallel);
    std::__cxx11::string::~string((string *)&target);
    std::__cxx11::string::~string((string *)&project_name);
    std::__cxx11::string::~string((string *)&configuration);
  }
  return bVar4;
}

Assistant:

bool cmBuildCommand(std::vector<std::string> const& args,
                    cmExecutionStatus& status)
{
  // Support the legacy signature of the command:
  if (args.size() == 2) {
    return TwoArgsSignature(args, status);
  }

  return MainSignature(args, status);
}